

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.cc
# Opt level: O0

bool google::protobuf::internal::GetAnyFieldDescriptors
               (Message *message,FieldDescriptor **type_url_field,FieldDescriptor **value_field)

{
  bool bVar1;
  Type TVar2;
  Descriptor *this;
  string *__lhs;
  FieldDescriptor *pFVar3;
  bool local_31;
  Descriptor *descriptor;
  FieldDescriptor **value_field_local;
  FieldDescriptor **type_url_field_local;
  Message *message_local;
  
  this = Message::GetDescriptor(message);
  __lhs = Descriptor::full_name_abi_cxx11_(this);
  bVar1 = std::operator!=(__lhs,"google.protobuf.Any");
  if (bVar1) {
    message_local._7_1_ = false;
  }
  else {
    pFVar3 = Descriptor::FindFieldByNumber(this,1);
    *type_url_field = pFVar3;
    pFVar3 = Descriptor::FindFieldByNumber(this,2);
    *value_field = pFVar3;
    local_31 = false;
    if (*type_url_field != (FieldDescriptor *)0x0) {
      TVar2 = FieldDescriptor::type(*type_url_field);
      local_31 = false;
      if ((TVar2 == TYPE_STRING) && (local_31 = false, *value_field != (FieldDescriptor *)0x0)) {
        TVar2 = FieldDescriptor::type(*value_field);
        local_31 = TVar2 == TYPE_BYTES;
      }
    }
    message_local._7_1_ = local_31;
  }
  return message_local._7_1_;
}

Assistant:

bool GetAnyFieldDescriptors(const Message& message,
                            const FieldDescriptor** type_url_field,
                            const FieldDescriptor** value_field) {
  const Descriptor* descriptor = message.GetDescriptor();
  if (descriptor->full_name() != kAnyFullTypeName) {
    return false;
  }
  *type_url_field = descriptor->FindFieldByNumber(1);
  *value_field = descriptor->FindFieldByNumber(2);
  return (*type_url_field != nullptr &&
          (*type_url_field)->type() == FieldDescriptor::TYPE_STRING &&
          *value_field != nullptr &&
          (*value_field)->type() == FieldDescriptor::TYPE_BYTES);
}